

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O2

int SHA512Input(SHA512Context *context,uint8_t *message_array,uint length)

{
  uint64_t *puVar1;
  uint8_t uVar2;
  short sVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  if (length == 0) {
    return 0;
  }
  if (length < 0x81) {
    if (message_array == (uint8_t *)0x0 || context == (SHA512Context *)0x0) {
      iVar5 = 1;
    }
    else if (context->Computed == 0) {
      iVar5 = context->Corrupted;
      if (iVar5 == 0) {
        iVar5 = 0;
        do {
          iVar6 = -length;
          while( true ) {
            iVar6 = iVar6 + 1;
            if (iVar6 == 1) {
              return iVar5;
            }
            if (iVar5 != 0) {
              return iVar5;
            }
            sVar3 = context->Message_Block_Index;
            if ((long)sVar3 < 0x80) break;
            context->Corrupted = 4;
            iVar5 = 4;
          }
          uVar2 = *message_array;
          context->Message_Block_Index = sVar3 + 1;
          context->Message_Block[sVar3] = uVar2;
          uVar4 = context->Length_Low;
          context->Length_Low = uVar4 + 8;
          if (uVar4 < 0xfffffffffffffff8) {
            context->Corrupted = 0;
LAB_001748e2:
            iVar5 = 0;
            if (context->Message_Block_Index == 0x80) {
              SHA384_512ProcessMessageBlock(context);
              iVar5 = context->Corrupted;
            }
          }
          else {
            puVar1 = &context->Length_High;
            *puVar1 = *puVar1 + 1;
            context->Corrupted = (uint)(*puVar1 == 0);
            iVar5 = 1;
            if (*puVar1 != 0) goto LAB_001748e2;
          }
          length = -iVar6;
          message_array = message_array + 1;
        } while( true );
      }
    }
    else {
      context->Corrupted = 3;
      iVar5 = 3;
    }
  }
  else {
    iVar5 = 4;
  }
  return iVar5;
}

Assistant:

int SHA512Input(SHA512Context *context,
    const uint8_t *message_array,
    unsigned int length)
{
    uint64_t addTemp;
    if (!length)
        return shaSuccess;
    
    if (length > (sizeof(context->Message_Block) / sizeof(context->Message_Block[0])))
        return shaBadParam;

    if (!context || !message_array)
        return shaNull;

    if (context->Computed) {
        context->Corrupted = shaStateError;
        return shaStateError;
    }

    if (context->Corrupted)
        return context->Corrupted;

    while (length-- && !context->Corrupted) {
        if (context->Message_Block_Index < SHA512_Message_Block_Size)
        {
            context->Message_Block[context->Message_Block_Index++] =
                (*message_array & 0xFF);

            if (!SHA384_512AddLength(context, 8) &&
                (context->Message_Block_Index == SHA512_Message_Block_Size))
                SHA384_512ProcessMessageBlock(context);

            message_array++;
        }
        else
        {
            context->Corrupted = shaBadParam;
        }
    }

    return context->Corrupted;
}